

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O0

void mcsini(mcscxdef *ctx,mcmcx1def *gmemctx,ulong maxsiz,osfildef *fp,char *swapfilename,
           errcxdef *errctx)

{
  uchar *puVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  errcxdef *in_R9;
  uchar *p;
  char *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  errcxdef *ctx_00;
  
  in_RDI[5] = 0;
  puVar1 = mchalo(in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  in_RDI[5] = puVar1;
  memset(puVar1,0,0x800);
  puVar1 = puVar1 + 0x800;
  *(uchar **)in_RDI[5] = puVar1;
  in_RDI[3] = 0;
  in_RDI[4] = in_RDX;
  *(undefined2 *)(in_RDI + 6) = 0;
  *in_RDI = in_RCX;
  in_RDI[2] = in_R9;
  in_RDI[7] = in_RSI;
  if (in_R8 == (char *)0x0) {
    in_RDI[1] = 0;
  }
  else {
    ctx_00 = in_R9;
    strlen(in_R8);
    puVar1 = mchalo(ctx_00,(size_t)puVar1,(char *)in_R9);
    in_RDI[1] = puVar1;
    strcpy((char *)in_RDI[1],in_R8);
  }
  return;
}

Assistant:

void mcsini(mcscxdef *ctx, mcmcx1def *gmemctx, ulong maxsiz,
            osfildef *fp, char *swapfilename, errcxdef *errctx)
{
    uchar  *p;

    ctx->mcscxtab = (mcsdsdef **)0;                   /* anticipate failure */
    
    /* allocate space from the low-level heap for page table and one page */
    p = mchalo(errctx, ((MCSPAGETAB * sizeof(mcsdsdef *))
                        + (MCSPAGECNT * sizeof(mcsdsdef))), "mcsini");
    
    /* set up the context with pointers to this chunk */
    ctx->mcscxtab = (mcsdsdef **)p;
    memset(p, 0, (size_t)(MCSPAGETAB * sizeof(mcsdsdef *)));
    p += MCSPAGETAB * sizeof(mcsdsdef *);
    ctx->mcscxtab[0] = (mcsdsdef *)p;
    
    /* set up the rest of the context */
    ctx->mcscxtop = (ulong)0;
    ctx->mcscxmax = maxsiz;
    ctx->mcscxmsg = 0;
    ctx->mcscxfp  = fp;
    ctx->mcscxerr = errctx;
    ctx->mcscxmem = gmemctx;

    /* 
     *   store the swap filename - make a copy so that the caller doesn't
     *   have to retain the original copy (in case it's on the stack) 
     */
    if (swapfilename != 0)
    {
        ctx->mcscxfname = (char *)mchalo(errctx,
                                         (strlen(swapfilename)+1),
                                         "mcsini");
        strcpy(ctx->mcscxfname, swapfilename);
    }
    else
        ctx->mcscxfname = 0;
}